

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O0

void __thiscall icu_63::RBBIRuleScanner::fixOpStack(RBBIRuleScanner *this,OpPrecedence p)

{
  RBBINode *this_00;
  undefined4 in_register_00000034;
  void *p_00;
  RBBINode *n;
  OpPrecedence p_local;
  RBBIRuleScanner *this_local;
  
  p_00 = (void *)CONCAT44(in_register_00000034,p);
  while( true ) {
    this_00 = this->fNodeStack[this->fNodeStackPtr + -1];
    if (this_00->fPrecedence == precZero) {
      error(this,U_BRK_ERROR_START);
      return;
    }
    if (((int)this_00->fPrecedence < (int)p) || ((int)this_00->fPrecedence < 3)) break;
    this_00->fRightChild = this->fNodeStack[this->fNodeStackPtr];
    this->fNodeStack[this->fNodeStackPtr]->fParent = this_00;
    this->fNodeStackPtr = this->fNodeStackPtr + -1;
  }
  if (2 < (int)p) {
    return;
  }
  if (this_00->fPrecedence != p) {
    p_00 = (void *)0x10207;
    error(this,U_BRK_MISMATCHED_PAREN);
  }
  this->fNodeStack[this->fNodeStackPtr + -1] = this->fNodeStack[this->fNodeStackPtr];
  this->fNodeStackPtr = this->fNodeStackPtr + -1;
  if (this_00 == (RBBINode *)0x0) {
    return;
  }
  RBBINode::~RBBINode(this_00);
  UMemory::operator_delete((UMemory *)this_00,p_00);
  return;
}

Assistant:

void RBBIRuleScanner::fixOpStack(RBBINode::OpPrecedence p) {
    RBBINode *n;
    // printNodeStack("entering fixOpStack()");
    for (;;) {
        n = fNodeStack[fNodeStackPtr-1];   // an operator node
        if (n->fPrecedence == 0) {
            RBBIDebugPuts("RBBIRuleScanner::fixOpStack, bad operator node");
            error(U_BRK_INTERNAL_ERROR);
            return;
        }

        if (n->fPrecedence < p || n->fPrecedence <= RBBINode::precLParen) {
            // The most recent operand goes with the current operator,
            //   not with the previously stacked one.
            break;
        }
            // Stack operator is a binary op  ( '|' or concatenation)
            //   TOS operand becomes right child of this operator.
            //   Resulting subexpression becomes the TOS operand.
            n->fRightChild = fNodeStack[fNodeStackPtr];
            fNodeStack[fNodeStackPtr]->fParent = n;
            fNodeStackPtr--;
        // printNodeStack("looping in fixOpStack()   ");
    }

    if (p <= RBBINode::precLParen) {
        // Scan is at a right paren or end of expression.
        //  The scanned item must match the stack, or else there was an error.
        //  Discard the left paren (or start expr) node from the stack,
            //  leaving the completed (sub)expression as TOS.
            if (n->fPrecedence != p) {
                // Right paren encountered matched start of expression node, or
                // end of expression matched with a left paren node.
                error(U_BRK_MISMATCHED_PAREN);
            }
            fNodeStack[fNodeStackPtr-1] = fNodeStack[fNodeStackPtr];
            fNodeStackPtr--;
            // Delete the now-discarded LParen or Start node.
            delete n;
    }
    // printNodeStack("leaving fixOpStack()");
}